

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O0

void __thiscall Arena_ConExcep_Test::TestBody(Arena_ConExcep_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_148;
  AssertHelper local_128;
  Message local_120;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_;
  Message local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  Message local_b8 [2];
  size_t *anon_var_0;
  type e;
  pair<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_ConExcepHelperTag,_4UL>_*,_(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_ConExcepHelperTag,_4UL>_*>
  local_78;
  byte local_65;
  bool gtest_caught_expected;
  undefined1 auStack_58 [8];
  TrueWithString gtest_msg;
  undefined1 local_30 [8];
  Arena arena;
  Arena_ConExcep_Test *this_local;
  
  arena._blocks._block._previous = (Block *)this;
  memt::Arena::Arena((Arena *)local_30);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_58 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_58);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_58);
  if (bVar1) {
    local_65 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_78 = memt::Arena::
                 allocArray<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_ConExcepHelperTag,4ul>>
                           ((Arena *)local_30,10);
    }
    if ((local_65 & 1) != 0) {
      e._4_4_ = 0;
      goto LAB_00112d78;
    }
    std::__cxx11::string::operator=
              ((string *)auStack_58,
               "Expected: arena.allocArray<ConExcepHelper>(10) throws an exception of type size_t.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_b8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
             ,0xb2,pcVar2);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
  testing::Message::~Message(local_b8);
  e._4_4_ = 1;
LAB_00112d78:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_58);
  if (e._4_4_ == 0) {
    (anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_ConExcepHelperTag,4ul>::
    resetLog_abi_cxx11_();
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[15],_nullptr>
              ((EqHelper *)local_d0,"ConExcepHelper::resetLog()","\"+1+2+3T4-3-2-1\"",&local_f0,
               (char (*) [15])"+1+2+3T4-3-2-1");
    std::__cxx11::string::~string((string *)&local_f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
    if (!bVar1) {
      testing::Message::Message(&local_f8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0xb3,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_f8);
    }
    e._4_4_ = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
    if (e._4_4_ == 0) {
      local_111 = memt::Arena::isEmpty((Arena *)local_30);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_110,&local_111,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
      if (!bVar1) {
        testing::Message::Message(&local_120);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_148,(internal *)local_110,(AssertionResult *)"arena.isEmpty()","false",
                   "true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_128,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                   ,0xb4,pcVar2);
        testing::internal::AssertHelper::operator=(&local_128,&local_120);
        testing::internal::AssertHelper::~AssertHelper(&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        testing::Message::~Message(&local_120);
      }
      e._4_4_ = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
      if (e._4_4_ == 0) {
        e._4_4_ = 0;
      }
    }
  }
  memt::Arena::~Arena((Arena *)local_30);
  return;
}

Assistant:

TEST(Arena, ConExcep) {
  memt::Arena arena;
  ASSERT_THROW(arena.allocArray<ConExcepHelper>(10), size_t);
  ASSERT_EQ(ConExcepHelper::resetLog(), "+1+2+3T4-3-2-1");
  ASSERT_TRUE(arena.isEmpty());
}